

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_quaternion.cpp
# Opt level: O0

ON_Quaternion *
ON_QuaternionProduct(ON_Quaternion *__return_storage_ptr__,ON_Quaternion *p,ON_Quaternion *q)

{
  ON_Quaternion *q_local;
  ON_Quaternion *p_local;
  
  ON_Quaternion::ON_Quaternion
            (__return_storage_ptr__,-p->d * q->d + -p->c * q->c + p->a * q->a + -(p->b * q->b),
             -p->d * q->c + p->c * q->d + p->a * q->b + p->b * q->a,
             p->d * q->b + p->c * q->a + p->a * q->c + -(p->b * q->d),
             p->d * q->a + -p->c * q->b + p->a * q->d + p->b * q->c);
  return __return_storage_ptr__;
}

Assistant:

ON_Quaternion ON_QuaternionProduct( const ON_Quaternion& p, const ON_Quaternion& q)
{
  return ON_Quaternion( p.a*q.a - p.b*q.b - p.c*q.c - p.d*q.d,
                        p.a*q.b + p.b*q.a + p.c*q.d - p.d*q.c,
                        p.a*q.c - p.b*q.d + p.c*q.a + p.d*q.b,
                        p.a*q.d + p.b*q.c - p.c*q.b + p.d*q.a);
}